

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O0

shared_ptr<cppcms::session_api> __thiscall
cppcms::session_pool::cookies_factory::get(cookies_factory *this)

{
  pointer peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  session_cookies *in_RDI;
  shared_ptr<cppcms::session_api> sVar3;
  shared_ptr<cppcms::session_api> *p;
  session_cookies *__p;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar4;
  session_cookies *in_stack_ffffffffffffffd0;
  
  __p = in_RDI;
  std::shared_ptr<cppcms::session_api>::shared_ptr((shared_ptr<cppcms::session_api> *)0x43420f);
  peVar1 = std::
           unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
           ::get((unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
                  *)in_RDI);
  _Var2._M_pi = extraout_RDX;
  if (peVar1 != (pointer)0x0) {
    operator_new(0x18);
    uVar4 = 1;
    peVar1 = std::
             unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
             ::operator->((unique_ptr<cppcms::sessions::encryptor_factory,_std::default_delete<cppcms::sessions::encryptor_factory>_>
                           *)0x434252);
    (**peVar1->_vptr_encryptor_factory)(&stack0xffffffffffffffd0);
    sessions::session_cookies::session_cookies
              (in_stack_ffffffffffffffd0,
               (unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                *)CONCAT17(uVar4,in_stack_ffffffffffffffc8));
    std::__shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>::
    reset<cppcms::sessions::session_cookies>(in_RSI,__p);
    std::unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
    ::~unique_ptr((unique_ptr<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
                   *)in_RSI);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &__p->super_session_api;
  return (shared_ptr<cppcms::session_api>)
         sVar3.super___shared_ptr<cppcms::session_api,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<session_api> get() 
	{
		booster::shared_ptr<session_api> p;
		if(pool_->encryptor_.get())
			p.reset(new session_cookies(pool_->encryptor_->get()));
		return p;
	}